

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkFFT.c
# Opt level: O0

void write_to_child_process(int (*pipes) [2],int numberAmount,complex *numbers)

{
  int iVar1;
  size_t sVar2;
  int iStack_186cc;
  char acStack_186c8 [4];
  int i;
  char floatToString [100000];
  complex *numbers_local;
  int numberAmount_local;
  int (*pipes_local) [2];
  
  for (iStack_186cc = 0; iStack_186cc < numberAmount; iStack_186cc = iStack_186cc + 1) {
    snprintf(acStack_186c8,100000,"%.5f %.5f*i\n",*(undefined8 *)numbers[iStack_186cc],
             *(undefined8 *)(numbers[iStack_186cc] + 8));
    if (iStack_186cc % 2 == 1) {
      iVar1 = pipes[1][1];
      sVar2 = strlen(acStack_186c8);
      write(iVar1,acStack_186c8,sVar2);
    }
    else {
      iVar1 = (*pipes)[1];
      sVar2 = strlen(acStack_186c8);
      write(iVar1,acStack_186c8,sVar2);
    }
  }
  return;
}

Assistant:

static void write_to_child_process(int pipes[4][2], int numberAmount, const double complex *numbers)
{
    char floatToString[MAXLENGTH]; //string that will be written to the pipe

    for (int i = 0; i < numberAmount; i++)
    {

        snprintf(floatToString, sizeof(floatToString), "%.5f %.5f*i\n", creal(numbers[i]), cimag(numbers[i]));
        if (i % 2 == 1)
            write(pipes[PIPE_O_WRITE][WRITE], floatToString, (strlen(floatToString)));
        else
            write(pipes[PIPE_E_WRITE][WRITE], floatToString, (strlen(floatToString)));
    }
}